

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  u8 uVar1;
  Btree *pBVar2;
  ulong n;
  sqlite3 *db_00;
  Vdbe *pVVar3;
  TriggerPrg *p;
  int iVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  char *zErrMsg;
  u32 local_290;
  u32 local_28c;
  sqlite3_stmt **local_288;
  Parse sParse;
  
  zErrMsg = (char *)0x0;
  local_288 = ppStmt;
  memset(&sParse,0,0xc4);
  memset(&sParse.sLastToken,0,0x90);
  if ((prepFlags & 1) != 0) {
    sParse.disableLookaside = '\x01';
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  lVar7 = 0;
  local_290 = prepFlags;
  sParse.pReprepare = pReprepare;
  for (lVar6 = 0; lVar6 < db->nDb; lVar6 = lVar6 + 1) {
    pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar7);
    if (pBVar2 != (Btree *)0x0) {
      sqlite3BtreeEnter(pBVar2);
      iVar4 = querySharedCacheTableLock(pBVar2,1,'\x01');
      sqlite3BtreeLeave(pBVar2);
      if (iVar4 != 0) {
        sqlite3ErrorWithMsg(db,iVar4,"database schema is locked: %s",
                            *(undefined8 *)((long)&db->aDb->zDbSName + lVar7));
        goto LAB_00141952;
      }
    }
    lVar7 = lVar7 + 0x20;
  }
  sqlite3VtabUnlockList(db);
  sParse.db = db;
  if ((nBytes < 0) || ((n = (ulong)(uint)nBytes, nBytes != 0 && (zSql[n - 1] == '\0')))) {
    sqlite3RunParser(&sParse,zSql,&zErrMsg);
  }
  else {
    if (db->aLimit[1] < nBytes) {
      sqlite3ErrorWithMsg(db,0x12,"statement too long");
      iVar4 = sqlite3ApiExit(db,0x12);
      goto LAB_00141952;
    }
    pcVar5 = sqlite3DbStrNDup(db,zSql,n);
    if (pcVar5 == (char *)0x0) {
      sParse.zTail = zSql + n;
    }
    else {
      sqlite3RunParser(&sParse,pcVar5,&zErrMsg);
      sParse.zTail = zSql + ((long)sParse.zTail - (long)pcVar5);
      sqlite3DbFreeNN(db,pcVar5);
    }
  }
  db_00 = sParse.db;
  if (sParse.rc == 0x65) {
    sParse.rc = 0;
  }
  if (sParse.checkSchema != '\0') {
    lVar6 = 0;
    for (lVar7 = 0; lVar7 < db_00->nDb; lVar7 = lVar7 + 1) {
      pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar6);
      if (pBVar2 != (Btree *)0x0) {
        uVar1 = pBVar2->inTrans;
        if ((uVar1 == '\0') && (iVar4 = sqlite3BtreeBeginTrans(pBVar2,0), iVar4 != 0)) {
          if ((iVar4 == 0xc0a) || (iVar4 == 7)) {
            sqlite3OomFault(db_00);
          }
          break;
        }
        sqlite3BtreeGetMeta(pBVar2,1,&local_28c);
        if (local_28c != **(u32 **)((long)&db_00->aDb->pSchema + lVar6)) {
          sqlite3ResetOneSchema(db_00,(int)lVar7);
          sParse.rc = 0x11;
        }
        if (uVar1 == '\0') {
          sqlite3BtreeCommit(pBVar2);
        }
      }
      lVar6 = lVar6 + 0x20;
    }
  }
  if (db->mallocFailed != '\0') {
    sParse.rc = 7;
  }
  iVar4 = sParse.rc;
  if (pzTail != (char **)0x0) {
    *pzTail = sParse.zTail;
  }
  if ((sParse.explain != '\0' && sParse.pVdbe != (Vdbe *)0x0) && sParse.rc == 0) {
    bVar8 = sParse.explain == '\x02';
    sqlite3VdbeSetNumCols(sParse.pVdbe,(uint)!bVar8 * 4 + 4);
    for (lVar6 = 0; ((ulong)bVar8 * 4 + 8) - (ulong)((uint)bVar8 * 8) != lVar6; lVar6 = lVar6 + 1) {
      sqlite3VdbeSetColName
                (sParse.pVdbe,(int)lVar6,0,
                 sqlite3Prepare_azColName_rel +
                 *(int *)(sqlite3Prepare_azColName_rel + (ulong)bVar8 * 0x20 + lVar6 * 4),
                 (_func_void_void_ptr *)0x0);
    }
  }
  pVVar3 = sParse.pVdbe;
  if ((db->init).busy == '\0') {
    if (sParse.pVdbe != (Vdbe *)0x0) {
      (sParse.pVdbe)->prepFlags = (u8)local_290;
      if (-1 < (char)(u8)local_290) {
        (sParse.pVdbe)->expmask = 0;
      }
      pcVar5 = sqlite3DbStrNDup((sParse.pVdbe)->db,zSql,(long)((int)sParse.zTail - (int)zSql));
      pVVar3->zSql = pcVar5;
      goto LAB_001418d1;
    }
LAB_001418eb:
    sParse.pVdbe = (Vdbe *)0x0;
LAB_001418ee:
    *local_288 = (sqlite3_stmt *)sParse.pVdbe;
  }
  else {
LAB_001418d1:
    if (sParse.pVdbe == (Vdbe *)0x0) goto LAB_001418eb;
    if ((iVar4 == 0) && (db->mallocFailed == '\0')) goto LAB_001418ee;
    sqlite3VdbeFinalize(sParse.pVdbe);
  }
  pcVar5 = zErrMsg;
  if (zErrMsg == (char *)0x0) {
    sqlite3Error(db,iVar4);
  }
  else {
    sqlite3ErrorWithMsg(db,iVar4,"%s",zErrMsg);
    sqlite3DbFreeNN(db,pcVar5);
  }
  while (p = sParse.pTriggerPrg, sParse.pTriggerPrg != (TriggerPrg *)0x0) {
    sParse.pTriggerPrg = (sParse.pTriggerPrg)->pNext;
    sqlite3DbFreeNN(db,p);
  }
LAB_00141952:
  sqlite3ParserReset(&sParse);
  iVar4 = sqlite3ApiExit(db,iVar4);
  return iVar4;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  char *zErrMsg = 0;        /* Error message */
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  memset(&sParse, 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pReprepare = pReprepare;
  assert( ppStmt && *ppStmt==0 );
  /* assert( !db->mallocFailed ); // not true with SQLITE_USE_ALLOCA */
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    db->lookaside.bDisable++;
  }

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold 
  ** locks on the schema, we just need to make sure nobody else is 
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  for(i=0; i<db->nDb; i++) {
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      assert( sqlite3BtreeHoldsMutex(pBt) );
      rc = sqlite3BtreeSchemaLocked(pBt);
      if( rc ){
        const char *zDb = db->aDb[i].zDbSName;
        sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
        testcase( db->flags & SQLITE_ReadUncommit );
        goto end_prepare;
      }
    }
  }

  sqlite3VtabUnlockList(db);

  sParse.db = db;
  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy, &zErrMsg);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql, &zErrMsg);
  }
  assert( 0==sParse.nQueryLoop );

  if( sParse.rc==SQLITE_DONE ) sParse.rc = SQLITE_OK;
  if( sParse.checkSchema ){
    schemaIsValid(&sParse);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
  }
  if( pzTail ){
    *pzTail = sParse.zTail;
  }
  rc = sParse.rc;

#ifndef SQLITE_OMIT_EXPLAIN
  if( rc==SQLITE_OK && sParse.pVdbe && sParse.explain ){
    static const char * const azColName[] = {
       "addr", "opcode", "p1", "p2", "p3", "p4", "p5", "comment",
       "selectid", "order", "from", "detail"
    };
    int iFirst, mx;
    if( sParse.explain==2 ){
      sqlite3VdbeSetNumCols(sParse.pVdbe, 4);
      iFirst = 8;
      mx = 12;
    }else{
      sqlite3VdbeSetNumCols(sParse.pVdbe, 8);
      iFirst = 0;
      mx = 8;
    }
    for(i=iFirst; i<mx; i++){
      sqlite3VdbeSetColName(sParse.pVdbe, i-iFirst, COLNAME_NAME,
                            azColName[i], SQLITE_STATIC);
    }
  }
#endif

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( sParse.pVdbe && (rc!=SQLITE_OK || db->mallocFailed) ){
    sqlite3VdbeFinalize(sParse.pVdbe);
    assert(!(*ppStmt));
  }else{
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
  }

  if( zErrMsg ){
    sqlite3ErrorWithMsg(db, rc, "%s", zErrMsg);
    sqlite3DbFree(db, zErrMsg);
  }else{
    sqlite3Error(db, rc);
  }

  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParserReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  return rc;
}